

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O2

void ht_timeline_destroy(HT_Timeline *timeline)

{
  HT_Feature *pHVar1;
  long lVar2;
  
  if (timeline != (HT_Timeline *)0x0) {
    ht_timeline_flush(timeline);
    ht_free(timeline->buffer);
    ht_timeline_listener_container_unref(timeline->listeners);
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      pHVar1 = timeline->features[lVar2];
      if (pHVar1 != (HT_Feature *)0x0) {
        (*pHVar1->klass->destroy)(pHVar1);
        timeline->features[lVar2] = (HT_Feature *)0x0;
      }
    }
    if (timeline->locking_policy != (_HT_Mutex *)0x0) {
      ht_free(timeline->locking_policy);
    }
    ht_free(timeline);
    return;
  }
  __assert_fail("timeline",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O2/hawktracer.cpp"
                ,0x7ca,"void ht_timeline_destroy(HT_Timeline *)");
}

Assistant:

void
ht_timeline_destroy(HT_Timeline* timeline)
{
    size_t i;

    assert(timeline);

    ht_timeline_flush(timeline);
    ht_free(timeline->buffer);

    ht_timeline_listener_container_unref(timeline->listeners);

    for (i = 0; i < sizeof(timeline->features) / sizeof(timeline->features[0]); i++)
    {
        if (timeline->features[i])
        {
            timeline->features[i]->klass->destroy(timeline->features[i]);
            timeline->features[i] = NULL;
        }
    }

    if (timeline->locking_policy)
    {
        ht_mutex_destroy(timeline->locking_policy);
    }

    ht_free(timeline);
}